

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

size_t Corrade::Utility::
       formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
                 (MutableStringView *buffer,char *format,BasicStringView<const_char> *args,
                 BasicStringView<const_char> *args_1,BasicStringView<const_char> *args_2,
                 String *args_3,BasicStringView<const_char> *args_4,
                 BasicStringView<const_char> *args_5,BasicStringView<const_char> *args_6,
                 unsigned_long *args_7,char **args_8)

{
  size_t sVar1;
  undefined1 local_128 [8];
  BufferFormatter formatters [10];
  String *args_local_3;
  BasicStringView<const_char> *args_local_2;
  BasicStringView<const_char> *args_local_1;
  BasicStringView<const_char> *args_local;
  char *format_local;
  MutableStringView *buffer_local;
  
  formatters[9]._value = args_3;
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)local_128,args);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[0]._value,args_1);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[1]._value,args_2);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::String>
            ((BufferFormatter *)&formatters[2]._value,(String *)formatters[9]._value);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[3]._value,args_4);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[4]._value,args_5);
  Implementation::BufferFormatter::BufferFormatter<Corrade::Containers::BasicStringView<char_const>>
            ((BufferFormatter *)&formatters[5]._value,args_6);
  Implementation::BufferFormatter::BufferFormatter<unsigned_long>
            ((BufferFormatter *)&formatters[6]._value,args_7);
  Implementation::BufferFormatter::BufferFormatter<char_const*>
            ((BufferFormatter *)&formatters[7]._value,args_8);
  Implementation::BufferFormatter::BufferFormatter((BufferFormatter *)&formatters[8]._value);
  sVar1 = Implementation::formatFormatters(buffer,format,(BufferFormatter *)local_128,9);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}